

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O2

void __thiscall MxxColl_AllgatherOne_Test::TestBody(MxxColl_AllgatherOne_Test *this)

{
  comm *comm;
  char *pcVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  AssertHelper local_a0;
  AssertionResult gtest_ar;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> pairs;
  pair<int,_double> x;
  comm c;
  
  mxx::comm::comm(&c);
  x.first = c.m_rank * 0xd;
  comm = (comm *)(ulong)(uint)x.first;
  x.second = 3.141 / (double)c.m_rank;
  mxx::comm::comm((comm *)&gtest_ar);
  mxx::allgather<std::pair<int,double>>(&pairs,(mxx *)&x,(pair<int,_double> *)&gtest_ar,comm);
  mxx::comm::~comm((comm *)&gtest_ar);
  local_a8.ptr_._0_4_ = c.m_size;
  local_a0.data_._0_4_ =
       (undefined4)
       ((ulong)((long)pairs.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)pairs.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"c.size()","(int)pairs.size()",(int *)&local_a8,(int *)&local_a0)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
               ,0x1a0,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
LAB_0012f24d:
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    lVar4 = 0;
    iVar2 = 0;
    for (lVar3 = 0; lVar3 < c.m_size; lVar3 = lVar3 + 1) {
      local_a8.ptr_._0_4_ = iVar2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"13*i","pairs[i].first",(int *)&local_a8,
                 (int *)((long)&(pairs.
                                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->first + lVar4));
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_a8);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                   ,0x1a3,pcVar1);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
LAB_0012f236:
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_a8);
        goto LAB_0012f24d;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_a8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (3.141 / (double)(int)lVar3);
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&gtest_ar,"3.141/i","pairs[i].second",(double *)&local_a8,
                 (double *)
                 ((long)&(pairs.
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->second + lVar4));
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_a8);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                   ,0x1a4,pcVar1);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
        goto LAB_0012f236;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      iVar2 = iVar2 + 0xd;
      lVar4 = lVar4 + 0x10;
    }
  }
  std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~_Vector_base
            (&pairs.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>);
  mxx::comm::~comm(&c);
  return;
}

Assistant:

TEST(MxxColl, AllgatherOne) {
    mxx::comm c;
    std::pair<int,double> x = std::make_pair(13*c.rank(), 3.141/c.rank());
    // allgather
    std::vector<std::pair<int, double> > pairs = mxx::allgather(x);

    ASSERT_EQ(c.size(), (int)pairs.size());
    for (int i = 0; i < c.size(); ++i)
    {
        ASSERT_EQ(13*i, pairs[i].first);
        ASSERT_EQ(3.141/i, pairs[i].second);
    }
}